

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

string * google::protobuf::compiler::cpp::FieldComment<google::protobuf::FieldDescriptor>
                   (string *__return_storage_ptr__,FieldDescriptor *field,Options *options)

{
  bool bVar1;
  reference pvVar2;
  allocator<char> local_11a;
  allocator<char> local_119;
  undefined1 auStack_118 [8];
  string_view chunk;
  int local_fc;
  undefined1 local_f8 [8];
  const_iterator __end0;
  const_iterator __begin0;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_50;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range3;
  DebugStringOptions debug_options;
  allocator<char> local_31;
  string_view local_30;
  Options *local_20;
  Options *options_local;
  FieldDescriptor *field_local;
  
  local_20 = options;
  options_local = (Options *)field;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  if ((options->strip_nonfunctional_codegen & 1U) == 0) {
    DebugStringOptions::DebugStringOptions((DebugStringOptions *)((long)&__range3 + 1));
    __range3._2_1_ = 1;
    __range3._3_1_ = 1;
    FieldDescriptor::DebugStringWithOptions_abi_cxx11_
              ((string *)&__begin0.delimiter_,(FieldDescriptor *)options_local,
               (DebugStringOptions *)((long)&__range3 + 1));
    absl::lts_20250127::
    StrSplit<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &__begin0.delimiter_,'\n');
    std::__cxx11::string::~string((string *)&__begin0.delimiter_);
    local_50 = &local_78;
    absl::lts_20250127::strings_internal::
    Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::begin((const_iterator *)&__end0.delimiter_,local_50);
    absl::lts_20250127::strings_internal::
    Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::end((const_iterator *)local_f8,local_50);
    bVar1 = absl::lts_20250127::strings_internal::operator!=
                      ((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__end0.delimiter_,
                       (SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_f8);
    if (bVar1) {
      pvVar2 = absl::lts_20250127::strings_internal::
               SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__end0.delimiter_);
      auStack_118 = (undefined1  [8])pvVar2->_M_len;
      chunk._M_len = (size_t)pvVar2->_M_str;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)__return_storage_ptr__,
                 (basic_string_view<char,_std::char_traits<char>_> *)auStack_118,&local_119);
      std::allocator<char>::~allocator(&local_119);
      local_fc = 1;
    }
    else {
      local_fc = 2;
    }
    absl::lts_20250127::strings_internal::
    Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Splitter(&local_78);
    if (local_fc != 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"<unknown>",&local_11a);
      std::allocator<char>::~allocator(&local_11a);
    }
  }
  else {
    local_30 = FieldDescriptor::name(field);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,&local_30,&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldComment(const T* field, const Options& options) {
  if (options.strip_nonfunctional_codegen) {
    return std::string(field->name());
  }
  // Print the field's (or oneof's) proto-syntax definition as a comment.
  // We don't want to print group bodies so we cut off after the first
  // line.
  DebugStringOptions debug_options;
  debug_options.elide_group_body = true;
  debug_options.elide_oneof_body = true;

  for (absl::string_view chunk :
       absl::StrSplit(field->DebugStringWithOptions(debug_options), '\n')) {
    return std::string(chunk);
  }

  return "<unknown>";
}